

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaig.h
# Opt level: O1

void Mini_AigPush(Mini_Aig_t *p,int Lit0,int Lit1)

{
  int iVar1;
  int *piVar2;
  int nCapMin;
  
  iVar1 = p->nCap;
  if (iVar1 < p->nSize + 2) {
    if (0x1ffffffe < p->nSize) {
      __assert_fail("p->nSize < MINI_AIG_NULL/4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/miniaig/miniaig.h"
                    ,0x51,"void Mini_AigPush(Mini_Aig_t *, int, int)");
    }
    nCapMin = iVar1 * 2;
    if (iVar1 < 0xff) {
      nCapMin = 0xff;
    }
    Mini_AigGrow(p,nCapMin);
  }
  piVar2 = p->pArray;
  iVar1 = p->nSize;
  p->nSize = iVar1 + 1;
  piVar2[iVar1] = Lit0;
  iVar1 = p->nSize;
  p->nSize = iVar1 + 1;
  piVar2[iVar1] = Lit1;
  return;
}

Assistant:

static void Mini_AigPush( Mini_Aig_t * p, int Lit0, int Lit1 )
{
    if ( p->nSize + 2 > p->nCap )
    {
        assert( p->nSize < MINI_AIG_NULL/4 );
        if ( p->nCap < MINI_AIG_START_SIZE )
            Mini_AigGrow( p, MINI_AIG_START_SIZE );
        else
            Mini_AigGrow( p, 2 * p->nCap );
    }
    p->pArray[p->nSize++] = Lit0;
    p->pArray[p->nSize++] = Lit1;
}